

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

RtMidiOutPtr rtmidi_out_create(RtMidiApi api,char *clientName)

{
  undefined8 uVar1;
  RtMidiOut *this;
  RtMidiError *err;
  RtMidiOut *rOut;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string name;
  RtMidiWrapper *wrp;
  char *clientName_local;
  RtMidiApi api_local;
  
  name.field_2._8_8_ = operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,clientName,&local_41);
  std::allocator<char>::~allocator(&local_41);
  this = (RtMidiOut *)operator_new(0x10);
  RtMidiOut::RtMidiOut(this,api,(string *)local_40);
  uVar1 = name.field_2._8_8_;
  *(RtMidiOut **)name.field_2._8_8_ = this;
  *(undefined8 *)(name.field_2._8_8_ + 8) = 0;
  *(undefined1 *)(name.field_2._8_8_ + 0x10) = 1;
  *(char **)(name.field_2._8_8_ + 0x18) = "";
  std::__cxx11::string::~string((string *)local_40);
  return (RtMidiOutPtr)uVar1;
}

Assistant:

RtMidiOutPtr rtmidi_out_create (enum RtMidiApi api, const char *clientName)
{
    RtMidiWrapper* wrp = new RtMidiWrapper;
    std::string name = clientName;

    try {
        RtMidiOut* rOut = new RtMidiOut ((RtMidi::Api) api, name);

        wrp->ptr = (void*) rOut;
        wrp->data = 0;
        wrp->ok  = true;
        wrp->msg = "";

    } catch (const RtMidiError & err) {
        wrp->ptr = 0;
        wrp->data = 0;
        wrp->ok  = false;
        wrp->msg = err.what ();
    }


    return wrp;
}